

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_schnorrsig_sign_internal
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_keypair *keypair,secp256k1_nonce_function_hardened noncefp,void *ndata)

{
  ulong uVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  code *pcVar11;
  uint uVar12;
  uchar *p;
  undefined1 auVar13 [16];
  int vflag_1;
  secp256k1_scalar sk;
  secp256k1_scalar k;
  uchar buf [32];
  uchar seckey [32];
  uchar pk_buf [32];
  secp256k1_ge r;
  secp256k1_scalar e;
  secp256k1_ge pk;
  secp256k1_gej rj;
  
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  if ((ctx->ecmult_gen_ctx).built == 0) {
    secp256k1_schnorrsig_sign_internal_cold_5();
  }
  else if (sig64 == (uchar *)0x0) {
    secp256k1_schnorrsig_sign_internal_cold_4();
  }
  else if (msglen == 0 || msg != (uchar *)0x0) {
    if (keypair != (secp256k1_keypair *)0x0) {
      pcVar11 = nonce_function_bip340;
      if (noncefp != (secp256k1_nonce_function_hardened)0x0) {
        pcVar11 = noncefp;
      }
      uVar8 = secp256k1_keypair_load(ctx,&sk,&pk,keypair);
      if (((byte)pk.y.n[0] & 1) != 0) {
        secp256k1_scalar_negate(&sk,&sk);
      }
      secp256k1_scalar_get_b32(seckey,&sk);
      secp256k1_fe_impl_get_b32(pk_buf,&pk.x);
      iVar9 = (*pcVar11)(buf,msg,msglen,seckey,pk_buf,"BIP0340/nonce",0xd,ndata);
      secp256k1_scalar_set_b32(&k,buf,(int *)0x0);
      if (iVar9 == 0) {
        uVar8 = 0;
      }
      if (((k.d[1] == 0 && k.d[0] == 0) && k.d[2] == 0) && k.d[3] == 0) {
        uVar8 = 0;
      }
      uVar12 = uVar8 ^ 1;
      rj.x.n[0]._0_4_ = uVar12;
      uVar1 = (long)(int)uVar12 - 1;
      k.d[1] = k.d[1] & uVar1;
      k.d[0] = (ulong)(uVar12 & 1) | k.d[0] & uVar1;
      k.d[3] = uVar1 & k.d[3];
      k.d[2] = k.d[2] & uVar1;
      secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&rj,&k);
      secp256k1_ge_set_gej(&r,&rj);
      if (ctx->declassify != 0) {
        secp256k1_schnorrsig_sign_internal_cold_1();
      }
      secp256k1_fe_impl_normalize_var(&r.y);
      if (((byte)r.y.n[0] & 1) != 0) {
        secp256k1_scalar_negate(&k,&k);
      }
      secp256k1_fe_impl_normalize_var(&r.x);
      secp256k1_fe_impl_get_b32(sig64,&r.x);
      secp256k1_schnorrsig_challenge(&e,sig64,msg,msglen,pk_buf);
      secp256k1_scalar_mul(&e,&e,&sk);
      secp256k1_scalar_add(&e,&e,&k);
      secp256k1_scalar_get_b32(sig64 + 0x20,&e);
      cVar7 = (char)uVar12 + -1;
      auVar13 = ZEXT216(CONCAT11(cVar7,cVar7));
      auVar13 = pshuflw(auVar13,auVar13,0);
      uVar12 = auVar13._0_4_;
      lVar10 = 0;
      do {
        puVar2 = (uint *)(sig64 + lVar10);
        uVar4 = puVar2[1];
        uVar5 = puVar2[2];
        uVar6 = puVar2[3];
        puVar3 = (uint *)(sig64 + lVar10);
        *puVar3 = *puVar2 & uVar12;
        puVar3[1] = uVar4 & uVar12;
        puVar3[2] = uVar5 & uVar12;
        puVar3[3] = uVar6 & uVar12;
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x40);
      return uVar8;
    }
    secp256k1_schnorrsig_sign_internal_cold_2();
  }
  else {
    secp256k1_schnorrsig_sign_internal_cold_3();
  }
  return 0;
}

Assistant:

static int secp256k1_schnorrsig_sign_internal(const secp256k1_context* ctx, unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_keypair *keypair, secp256k1_nonce_function_hardened noncefp, void *ndata) {
    secp256k1_scalar sk;
    secp256k1_scalar e;
    secp256k1_scalar k;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_ge r;
    unsigned char buf[32] = { 0 };
    unsigned char pk_buf[32];
    unsigned char seckey[32];
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg != NULL || msglen == 0);
    ARG_CHECK(keypair != NULL);

    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_bip340;
    }

    ret &= secp256k1_keypair_load(ctx, &sk, &pk, keypair);
    /* Because we are signing for a x-only pubkey, the secret key is negated
     * before signing if the point corresponding to the secret key does not
     * have an even Y. */
    if (secp256k1_fe_is_odd(&pk.y)) {
        secp256k1_scalar_negate(&sk, &sk);
    }

    secp256k1_scalar_get_b32(seckey, &sk);
    secp256k1_fe_get_b32(pk_buf, &pk.x);
    ret &= !!noncefp(buf, msg, msglen, seckey, pk_buf, bip340_algo, sizeof(bip340_algo), ndata);
    secp256k1_scalar_set_b32(&k, buf, NULL);
    ret &= !secp256k1_scalar_is_zero(&k);
    secp256k1_scalar_cmov(&k, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rj, &k);
    secp256k1_ge_set_gej(&r, &rj);

    /* We declassify r to allow using it as a branch point. This is fine
     * because r is not a secret. */
    secp256k1_declassify(ctx, &r, sizeof(r));
    secp256k1_fe_normalize_var(&r.y);
    if (secp256k1_fe_is_odd(&r.y)) {
        secp256k1_scalar_negate(&k, &k);
    }
    secp256k1_fe_normalize_var(&r.x);
    secp256k1_fe_get_b32(&sig64[0], &r.x);

    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg, msglen, pk_buf);
    secp256k1_scalar_mul(&e, &e, &sk);
    secp256k1_scalar_add(&e, &e, &k);
    secp256k1_scalar_get_b32(&sig64[32], &e);

    secp256k1_memczero(sig64, 64, !ret);
    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);
    secp256k1_memclear(seckey, sizeof(seckey));
    secp256k1_gej_clear(&rj);

    return ret;
}